

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADAU1462_IC_1.h
# Opt level: O2

void default_download_IC_1(void)

{
  int iVar1;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 *puStack_48;
  undefined8 uStack_40;
  undefined4 uStack_38;
  uint32_t uStack_34;
  uint16_t uStack_30;
  uint8_t uStack_2e;
  undefined4 uStack_2d;
  undefined1 uStack_29;
  uint8_t *puStack_28;
  undefined8 uStack_20;
  undefined4 uStack_18;
  uint32_t uStack_14;
  
  uStack_20 = 0x10120f;
  spi_write(0xf890,2,"");
  uStack_20 = 0x101220;
  spi_write(0xf890,2,"");
  uStack_20 = 0x10122a;
  usleep(20000);
  uStack_20 = 0x10123b;
  spi_write(0xf400,2,"");
  uStack_20 = 0x10124c;
  spi_write(0xf400,2,"");
  uStack_20 = 0x101256;
  usleep(20000);
  uStack_20 = 0x101267;
  spi_write(0xf403,2,"");
  uStack_20 = 0x101278;
  spi_write(0xf403,2,"");
  uStack_20 = 0x101289;
  spi_write(0xf003,2,"");
  uStack_20 = 0x10129a;
  spi_write(0xf001,2,"");
  uStack_20 = 0x1012ab;
  spi_write(0xf002,2,"");
  uStack_20 = 0x1012bc;
  spi_write(0xf005,2,"");
  uStack_20 = 0x1012cd;
  spi_write(0xf003,2,"");
  uStack_20 = 0x1012d7;
  usleep(20000);
  uStack_20 = 0x1012e8;
  spi_write(0xf050,2,R14_POWER_ENABLE0_IC_1_Default);
  uStack_20 = 0x1012f9;
  spi_write(0xf051,2,"");
  uStack_20 = 0x10130a;
  spi_write(0xf784,2,"");
  uStack_20 = 0x10131b;
  spi_write(0xf78c,2,"");
  uStack_20 = 0x10132c;
  spi_write(0xf794,2,"");
  uStack_20 = 0x10133d;
  spi_write(0xf795,2,"");
  uStack_20 = 0x10134e;
  spi_write(0xf796,2,"");
  uStack_20 = 0x10135f;
  spi_write(0xf797,2,"");
  uStack_20 = 0x101370;
  spi_write(0xf7a3,2,"");
  uStack_20 = 0x101381;
  spi_write(0xf100,2,"");
  uStack_20 = 0x101392;
  spi_write(0xf101,2,"");
  uStack_20 = 0x1013a3;
  spi_write(0xf102,2,"");
  uStack_20 = 0x1013b4;
  spi_write(0xf103,2,"");
  uStack_20 = 0x1013c5;
  spi_write(0xf107,2,"");
  uStack_20 = 0x1013d6;
  spi_write(0xf140,2,"");
  uStack_20 = 0x1013e7;
  spi_write(0xf141,2,"");
  uStack_20 = 0x1013f8;
  spi_write(0xf142,2,"");
  uStack_20 = 0x101409;
  spi_write(0xf143,2,"");
  uStack_20 = 0x10141a;
  spi_write(0xf144,2,"");
  uStack_20 = 0x10142b;
  spi_write(0xf147,2,"");
  uStack_20 = 0x10143c;
  spi_write(0xf180,2,"");
  uStack_20 = 0x10144d;
  spi_write(0xf181,2,"");
  uStack_20 = 0x10145e;
  spi_write(0xf182,2,"");
  uStack_20 = 0x10146f;
  spi_write(0xf183,2,"");
  uStack_20 = 0x101480;
  spi_write(0xf184,2,"");
  uStack_20 = 0x101491;
  spi_write(0xf185,2,"");
  uStack_20 = 0x1014a2;
  spi_write(0xf186,2,"");
  uStack_20 = 0x1014b3;
  spi_write(0xf187,2,"");
  uStack_20 = 0x1014c4;
  spi_write(0xf188,2,"");
  uStack_20 = 0x1014d5;
  spi_write(0xf189,2,"");
  uStack_20 = 0x1014e6;
  spi_write(0xf18a,2,"");
  uStack_20 = 0x1014f7;
  spi_write(0xf18b,2,"");
  uStack_20 = 0x101508;
  spi_write(0xf18c,2,"");
  uStack_20 = 0x101519;
  spi_write(0xf18d,2,"");
  uStack_20 = 0x10152a;
  spi_write(0xf18e,2,"");
  uStack_20 = 0x10153b;
  spi_write(0xf18f,2,"");
  uStack_20 = 0x10154c;
  spi_write(0xf190,2,"");
  uStack_20 = 0x10155d;
  spi_write(0xf191,2,"");
  uStack_20 = 0x10156e;
  spi_write(0xf192,2,"");
  uStack_20 = 0x10157f;
  spi_write(0xf193,2,"");
  uStack_20 = 0x101590;
  spi_write(0xf194,2,"");
  uStack_20 = 0x1015a1;
  spi_write(0xf195,2,"");
  uStack_20 = 0x1015b2;
  spi_write(0xf196,2,"");
  uStack_20 = 0x1015c3;
  spi_write(0xf197,2,"");
  uStack_20 = 0x1015d4;
  spi_write(0xf201,2,"");
  uStack_20 = 0x1015e5;
  spi_write(0xf205,2,"");
  uStack_20 = 0x1015f6;
  spi_write(0xf209,2,"");
  uStack_20 = 0x101607;
  spi_write(0xf20d,2,"");
  uStack_20 = 0x101618;
  spi_write(0xf210,2,R62_SERIAL_BYTE_4_0_IC_1_Default);
  uStack_20 = 0x101629;
  spi_write(0xf214,2,R63_SERIAL_BYTE_5_0_IC_1_Default);
  uStack_20 = 0x10163a;
  spi_write(0xf218,2,R64_SERIAL_BYTE_6_0_IC_1_Default);
  uStack_20 = 0x10164b;
  spi_write(0xf21c,2,"l@");
  uStack_20 = 0x10165f;
  spi_write(0xc000,0xec0,"");
  uStack_20 = 0x101670;
  spi_write(0,0xc90,"");
  uStack_20 = 0x101684;
  spi_write(0x6000,0x870,"");
  uStack_20 = 0x101695;
  spi_write(0xf403,2,"");
  uStack_20 = 0x1016a6;
  spi_write(0xf404,2,"");
  uStack_20 = 0x1016b7;
  spi_write(0xf401,2,"");
  uStack_20 = 0x1016c8;
  spi_write(0xf402,2,"");
  uStack_20 = 0x1016d9;
  spi_write(0xf402,2,"");
  uStack_20 = 0x1016e3;
  usleep(20000);
  uStack_40 = 0;
  uStack_34 = speed;
  uStack_30 = delay;
  uStack_2e = bits;
  uStack_29 = 0;
  uStack_2d = 0;
  puStack_28 = "";
  _uStack_18 = CONCAT44(speed,2);
  puStack_48 = &uStack_4b;
  uStack_4b = 0;
  uStack_4a = 0xf4;
  uStack_49 = 0;
  uStack_38 = 3;
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    puStack_28 = (uint8_t *)0x0;
  }
  uStack_20 = 0;
  iVar1 = ioctl(i2s_fd,0x40406b00,&puStack_48);
  if (iVar1 < 1) {
    pabort("write: can\'t send spi message");
    return;
  }
  return;
}

Assistant:

void default_download_IC_1() {
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOFT_RESET_IC_1_ADDR, REG_SOFT_RESET_IC_1_BYTE, R0_SOFT_RESET_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOFT_RESET_IC_1_ADDR, REG_SOFT_RESET_IC_1_BYTE, R1_SOFT_RESET_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R2_RESET_DELAY_IC_1_SIZE, R2_RESET_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R3_HIBERNATE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R4_HIBERNATE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R5_HIBERNATE_DELAY_IC_1_SIZE, R5_HIBERNATE_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R6_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R7_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_ENABLE_IC_1_ADDR, REG_PLL_ENABLE_IC_1_BYTE, R8_PLL_ENABLE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_CTRL1_IC_1_ADDR, REG_PLL_CTRL1_IC_1_BYTE, R9_PLL_CTRL1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_CLK_SRC_IC_1_ADDR, REG_PLL_CLK_SRC_IC_1_BYTE, R10_PLL_CLK_SRC_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_MCLK_OUT_IC_1_ADDR, REG_MCLK_OUT_IC_1_BYTE, R11_MCLK_OUT_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_PLL_ENABLE_IC_1_ADDR, REG_PLL_ENABLE_IC_1_BYTE, R12_PLL_ENABLE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R13_PLL_LOCK_DELAY_IC_1_SIZE, R13_PLL_LOCK_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_POWER_ENABLE0_IC_1_ADDR, REG_POWER_ENABLE0_IC_1_BYTE, R14_POWER_ENABLE0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_POWER_ENABLE1_IC_1_ADDR, REG_POWER_ENABLE1_IC_1_BYTE, R15_POWER_ENABLE1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_BCLK_OUT0_PIN_IC_1_ADDR, REG_BCLK_OUT0_PIN_IC_1_BYTE, R16_BCLK_OUT0_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_LRCLK_OUT0_PIN_IC_1_ADDR, REG_LRCLK_OUT0_PIN_IC_1_BYTE, R17_LRCLK_OUT0_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SDATA_OUT0_PIN_IC_1_ADDR, REG_SDATA_OUT0_PIN_IC_1_BYTE, R18_SDATA_OUT0_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SDATA_OUT1_PIN_IC_1_ADDR, REG_SDATA_OUT1_PIN_IC_1_BYTE, R19_SDATA_OUT1_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SDATA_OUT2_PIN_IC_1_ADDR, REG_SDATA_OUT2_PIN_IC_1_BYTE, R20_SDATA_OUT2_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SDATA_OUT3_PIN_IC_1_ADDR, REG_SDATA_OUT3_PIN_IC_1_BYTE, R21_SDATA_OUT3_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_CLKOUT_PIN_IC_1_ADDR, REG_CLKOUT_PIN_IC_1_BYTE, R22_CLKOUT_PIN_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_INPUT0_IC_1_ADDR, REG_ASRC_INPUT0_IC_1_BYTE, R23_ASRC_INPUT0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_INPUT1_IC_1_ADDR, REG_ASRC_INPUT1_IC_1_BYTE, R24_ASRC_INPUT1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_INPUT2_IC_1_ADDR, REG_ASRC_INPUT2_IC_1_BYTE, R25_ASRC_INPUT2_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_INPUT3_IC_1_ADDR, REG_ASRC_INPUT3_IC_1_BYTE, R26_ASRC_INPUT3_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_INPUT7_IC_1_ADDR, REG_ASRC_INPUT7_IC_1_BYTE, R27_ASRC_INPUT7_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE0_IC_1_ADDR, REG_ASRC_OUT_RATE0_IC_1_BYTE, R28_ASRC_OUT_RATE0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE1_IC_1_ADDR, REG_ASRC_OUT_RATE1_IC_1_BYTE, R29_ASRC_OUT_RATE1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE2_IC_1_ADDR, REG_ASRC_OUT_RATE2_IC_1_BYTE, R30_ASRC_OUT_RATE2_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE3_IC_1_ADDR, REG_ASRC_OUT_RATE3_IC_1_BYTE, R31_ASRC_OUT_RATE3_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE4_IC_1_ADDR, REG_ASRC_OUT_RATE4_IC_1_BYTE, R32_ASRC_OUT_RATE4_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_ASRC_OUT_RATE7_IC_1_ADDR, REG_ASRC_OUT_RATE7_IC_1_BYTE, R33_ASRC_OUT_RATE7_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE0_IC_1_ADDR, REG_SOUT_SOURCE0_IC_1_BYTE, R34_SOUT_SOURCE0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE1_IC_1_ADDR, REG_SOUT_SOURCE1_IC_1_BYTE, R35_SOUT_SOURCE1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE2_IC_1_ADDR, REG_SOUT_SOURCE2_IC_1_BYTE, R36_SOUT_SOURCE2_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE3_IC_1_ADDR, REG_SOUT_SOURCE3_IC_1_BYTE, R37_SOUT_SOURCE3_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE4_IC_1_ADDR, REG_SOUT_SOURCE4_IC_1_BYTE, R38_SOUT_SOURCE4_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE5_IC_1_ADDR, REG_SOUT_SOURCE5_IC_1_BYTE, R39_SOUT_SOURCE5_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE6_IC_1_ADDR, REG_SOUT_SOURCE6_IC_1_BYTE, R40_SOUT_SOURCE6_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE7_IC_1_ADDR, REG_SOUT_SOURCE7_IC_1_BYTE, R41_SOUT_SOURCE7_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE8_IC_1_ADDR, REG_SOUT_SOURCE8_IC_1_BYTE, R42_SOUT_SOURCE8_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE9_IC_1_ADDR, REG_SOUT_SOURCE9_IC_1_BYTE, R43_SOUT_SOURCE9_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE10_IC_1_ADDR, REG_SOUT_SOURCE10_IC_1_BYTE, R44_SOUT_SOURCE10_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE11_IC_1_ADDR, REG_SOUT_SOURCE11_IC_1_BYTE, R45_SOUT_SOURCE11_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE12_IC_1_ADDR, REG_SOUT_SOURCE12_IC_1_BYTE, R46_SOUT_SOURCE12_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE13_IC_1_ADDR, REG_SOUT_SOURCE13_IC_1_BYTE, R47_SOUT_SOURCE13_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE14_IC_1_ADDR, REG_SOUT_SOURCE14_IC_1_BYTE, R48_SOUT_SOURCE14_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE15_IC_1_ADDR, REG_SOUT_SOURCE15_IC_1_BYTE, R49_SOUT_SOURCE15_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE16_IC_1_ADDR, REG_SOUT_SOURCE16_IC_1_BYTE, R50_SOUT_SOURCE16_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE17_IC_1_ADDR, REG_SOUT_SOURCE17_IC_1_BYTE, R51_SOUT_SOURCE17_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE18_IC_1_ADDR, REG_SOUT_SOURCE18_IC_1_BYTE, R52_SOUT_SOURCE18_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE19_IC_1_ADDR, REG_SOUT_SOURCE19_IC_1_BYTE, R53_SOUT_SOURCE19_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE20_IC_1_ADDR, REG_SOUT_SOURCE20_IC_1_BYTE, R54_SOUT_SOURCE20_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE21_IC_1_ADDR, REG_SOUT_SOURCE21_IC_1_BYTE, R55_SOUT_SOURCE21_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE22_IC_1_ADDR, REG_SOUT_SOURCE22_IC_1_BYTE, R56_SOUT_SOURCE22_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SOUT_SOURCE23_IC_1_ADDR, REG_SOUT_SOURCE23_IC_1_BYTE, R57_SOUT_SOURCE23_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_0_1_IC_1_ADDR, REG_SERIAL_BYTE_0_1_IC_1_BYTE, R58_SERIAL_BYTE_0_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_1_1_IC_1_ADDR, REG_SERIAL_BYTE_1_1_IC_1_BYTE, R59_SERIAL_BYTE_1_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_2_1_IC_1_ADDR, REG_SERIAL_BYTE_2_1_IC_1_BYTE, R60_SERIAL_BYTE_2_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_3_1_IC_1_ADDR, REG_SERIAL_BYTE_3_1_IC_1_BYTE, R61_SERIAL_BYTE_3_1_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_4_0_IC_1_ADDR, REG_SERIAL_BYTE_4_0_IC_1_BYTE, R62_SERIAL_BYTE_4_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_5_0_IC_1_ADDR, REG_SERIAL_BYTE_5_0_IC_1_BYTE, R63_SERIAL_BYTE_5_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_6_0_IC_1_ADDR, REG_SERIAL_BYTE_6_0_IC_1_BYTE, R64_SERIAL_BYTE_6_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_SERIAL_BYTE_7_0_IC_1_ADDR, REG_SERIAL_BYTE_7_0_IC_1_BYTE, R65_SERIAL_BYTE_7_0_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, PROGRAM_ADDR_IC_1, PROGRAM_SIZE_IC_1, Program_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, PARAM_ADDR_IC_1, PARAM_SIZE_IC_1, Param_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, DM1_DATA_ADDR_IC_1, DM1_DATA_SIZE_IC_1, DM1_DATA_Data_IC_1 );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_KILL_CORE_IC_1_ADDR, REG_KILL_CORE_IC_1_BYTE, R69_KILL_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_ADDRESS_IC_1_ADDR, REG_START_ADDRESS_IC_1_BYTE, R70_START_ADDRESS_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_PULSE_IC_1_ADDR, REG_START_PULSE_IC_1_BYTE, R71_START_PULSE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_CORE_IC_1_ADDR, REG_START_CORE_IC_1_BYTE, R72_START_CORE_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_START_CORE_IC_1_ADDR, REG_START_CORE_IC_1_BYTE, R73_START_CORE_IC_1_Default );
	SIGMA_WRITE_DELAY( DEVICE_ADDR_IC_1, R74_START_DELAY_IC_1_SIZE, R74_START_DELAY_IC_1_Default );
	SIGMA_WRITE_REGISTER_BLOCK( DEVICE_ADDR_IC_1, REG_HIBERNATE_IC_1_ADDR, REG_HIBERNATE_IC_1_BYTE, R75_HIBERNATE_IC_1_Default );
}